

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_test.cpp
# Opt level: O0

void operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>>
               (rt_expr<viennamath::rt_expression_interface<double>_> *e,
               rt_expr<viennamath::rt_expression_interface<double>_> *t,
               rt_constant<long,_viennamath::rt_expression_interface<double>_> *u)

{
  numeric_type t2;
  numeric_type u2;
  int local_78 [3];
  ct_vector_3<int,_int,_int> local_6c;
  rt_constant<long,_viennamath::rt_expression_interface<double>_> local_60 [2];
  int local_40 [3];
  ct_vector_3<int,_int,_int> local_34;
  rt_expr<viennamath::rt_expression_interface<double>_> local_28;
  rt_constant<long,_viennamath::rt_expression_interface<double>_> *local_20;
  rt_constant<long,_viennamath::rt_expression_interface<double>_> *u_local;
  rt_expr<viennamath::rt_expression_interface<double>_> *t_local;
  rt_expr<viennamath::rt_expression_interface<double>_> *e_local;
  
  local_20 = u;
  u_local = (rt_constant<long,_viennamath::rt_expression_interface<double>_> *)t;
  t_local = e;
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr(&local_28,t);
  local_40[2] = 4;
  local_40[1] = 6;
  local_40[0] = 8;
  viennamath::make_vector<int,int,int>((viennamath *)&local_34,local_40 + 2,local_40 + 1,local_40);
  t2 = viennamath::
       eval<viennamath::rt_expression_interface<double>,viennamath::ct_vector_3<int,int,int>>
                 (&local_28,&local_34);
  viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>::rt_constant
            (local_60,local_20);
  local_78[2] = 4;
  local_78[1] = 6;
  local_78[0] = 8;
  viennamath::make_vector<int,int,int>((viennamath *)&local_6c,local_78 + 2,local_78 + 1,local_78);
  u2 = viennamath::
       eval<long,viennamath::rt_expression_interface<double>,viennamath::ct_vector_3<int,int,int>>
                 (local_60,&local_6c);
  operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_constant<long,viennamath::rt_expression_interface<double>>>
            (e,t,u,t2,u2);
  viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>::~rt_constant
            (local_60);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::~rt_expr(&local_28);
  return;
}

Assistant:

void operations_test(E & e, T const & t, U const & u)
{
  operations_test(e, t, u, viennamath::eval(t, viennamath::make_vector(4, 6, 8)),
                           viennamath::eval(u, viennamath::make_vector(4, 6, 8)) );
}